

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_vector_column.h
# Opt level: O3

bool Gudhi::persistence_matrix::operator==
               (Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
                *c1,Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
                    *c2)

{
  stored_size_type sVar1;
  bool bVar2;
  pointer ppEVar3;
  pointer ppEVar4;
  long lVar5;
  
  bVar2 = true;
  if (c1 != c2) {
    sVar1 = (c1->column_).
            super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
            .super_type.m_holder.m_size;
    if (sVar1 == (c2->column_).
                 super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
                 .super_type.m_holder.m_size) {
      if (sVar1 != 0) {
        ppEVar3 = (c1->column_).
                  super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
                  .super_type.m_holder.m_start;
        ppEVar4 = (c2->column_).
                  super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
                  .super_type.m_holder.m_start;
        lVar5 = sVar1 * 8;
        do {
          lVar5 = lVar5 + -8;
          if ((ppEVar3 == (pointer)0x0) || (ppEVar4 == (pointer)0x0)) {
            __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,
                          "reference boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, true, true>>> **, true>::operator*() const [Pointer = Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, true, true>>> **, IsConst = true]"
                         );
          }
          if (((*ppEVar3)->rowIndex_ != (*ppEVar4)->rowIndex_) ||
             (((*ppEVar3)->super_Entry_field_element_option).element_ !=
              ((*ppEVar4)->super_Entry_field_element_option).element_)) goto LAB_0015f49d;
          ppEVar3 = ppEVar3 + 1;
          ppEVar4 = ppEVar4 + 1;
        } while (lVar5 != 0);
      }
    }
    else {
LAB_0015f49d:
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool operator==(const Naive_vector_column& c1, const Naive_vector_column& c2) {
    if (&c1 == &c2) return true;
    if (c1.column_.size() != c2.column_.size()) return false;

    auto it1 = c1.column_.begin();
    auto it2 = c2.column_.begin();
    while (it1 != c1.column_.end() && it2 != c2.column_.end()) {
      if constexpr (Master_matrix::Option_list::is_z2) {
        if ((*it1)->get_row_index() != (*it2)->get_row_index()) return false;
      } else {
        if ((*it1)->get_row_index() != (*it2)->get_row_index() || (*it1)->get_element() != (*it2)->get_element())
          return false;
      }
      ++it1;
      ++it2;
    }
    return true;
  }